

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

z_size_t gz_write(gz_statep state,voidpc buf,z_size_t len)

{
  off_t *poVar1;
  uInt *puVar2;
  uInt uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t __n;
  z_size_t zVar7;
  ulong uVar8;
  
  if ((len != 0) && ((state->size != 0 || (iVar4 = gz_init(state), iVar4 != -1)))) {
    if (state->seek != 0) {
      state->seek = 0;
      iVar4 = gz_zero(state,state->skip);
      if (iVar4 == -1) {
        return 0;
      }
    }
    uVar8 = len;
    if (len < state->size) {
      do {
        uVar3 = (state->strm).avail_in;
        if (uVar3 == 0) {
          (state->strm).next_in = state->in;
        }
        uVar5 = (uVar3 + (int)(state->strm).next_in) - (int)state->in;
        uVar6 = state->size - uVar5;
        __n = uVar8 & 0xffffffff;
        if (uVar6 <= uVar8) {
          __n = (size_t)uVar6;
        }
        memcpy(state->in + uVar5,buf,__n);
        puVar2 = &(state->strm).avail_in;
        *puVar2 = *puVar2 + (int)__n;
        poVar1 = &(state->x).pos;
        *poVar1 = *poVar1 + __n;
        if (uVar8 - __n == 0) {
          return len;
        }
        buf = (voidpc)((long)buf + __n);
        iVar4 = gz_comp(state,0);
        uVar8 = uVar8 - __n;
      } while (iVar4 != -1);
    }
    else if (((state->strm).avail_in == 0) || (iVar4 = gz_comp(state,0), iVar4 != -1)) {
      (state->strm).next_in = (Bytef *)buf;
      zVar7 = len;
      while( true ) {
        uVar8 = 0xffffffff;
        if (zVar7 < 0xffffffff) {
          uVar8 = zVar7;
        }
        (state->strm).avail_in = (uInt)uVar8;
        poVar1 = &(state->x).pos;
        *poVar1 = *poVar1 + uVar8;
        iVar4 = gz_comp(state,0);
        if (iVar4 == -1) break;
        zVar7 = zVar7 - uVar8;
        if (zVar7 == 0) {
          return len;
        }
      }
    }
  }
  return 0;
}

Assistant:

local z_size_t gz_write(gz_statep state, voidpc buf, z_size_t len) {
    z_size_t put = len;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return 0;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return 0;
    }

    /* for small len, copy to input buffer, otherwise compress directly */
    if (len < state->size) {
        /* copy to input buffer, compress when full */
        do {
            unsigned have, copy;

            if (state->strm.avail_in == 0)
                state->strm.next_in = state->in;
            have = (unsigned)((state->strm.next_in + state->strm.avail_in) -
                              state->in);
            copy = state->size - have;
            if (copy > len)
                copy = (unsigned)len;
            memcpy(state->in + have, buf, copy);
            state->strm.avail_in += copy;
            state->x.pos += copy;
            buf = (const char *)buf + copy;
            len -= copy;
            if (len && gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
        } while (len);
    }
    else {
        /* consume whatever's left in the input buffer */
        if (state->strm.avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;

        /* directly compress user buffer to file */
        state->strm.next_in = (z_const Bytef *)buf;
        do {
            unsigned n = (unsigned)-1;
            if (n > len)
                n = (unsigned)len;
            state->strm.avail_in = n;
            state->x.pos += n;
            if (gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
            len -= n;
        } while (len);
    }

    /* input was all buffered or compressed */
    return put;
}